

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl-util.h
# Opt level: O0

void STLDeleteElementsAndClear<std::vector<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*,std::allocator<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*>>>
               (vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                *c)

{
  bool bVar1;
  iterator this;
  reference ppvVar2;
  iterator iter;
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  *in_stack_ffffffffffffffd8;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_ffffffffffffffe0;
  
  this = std::
         vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
         ::begin(in_stack_ffffffffffffffd8);
  while( true ) {
    std::
    vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
    ::end(in_stack_ffffffffffffffd8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_**,_std::vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>_>
                        *)in_stack_ffffffffffffffe0,
                       (__normal_iterator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_**,_std::vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>_>
                        *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    ppvVar2 = __gnu_cxx::
              __normal_iterator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_**,_std::vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>_>
              ::operator*((__normal_iterator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_**,_std::vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>_>
                           *)&stack0xfffffffffffffff0);
    if (*ppvVar2 != (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)0x0) {
      ppvVar2 = __gnu_cxx::
                __normal_iterator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_**,_std::vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>_>
                ::operator*((__normal_iterator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_**,_std::vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>_>
                             *)&stack0xfffffffffffffff0);
      in_stack_ffffffffffffffe0 = *ppvVar2;
      if (in_stack_ffffffffffffffe0 != (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)0x0) {
        std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::~vector
                  ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)this._M_current);
        operator_delete(in_stack_ffffffffffffffe0);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_**,_std::vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>_>
    ::operator++((__normal_iterator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_**,_std::vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>_>
                  *)&stack0xfffffffffffffff0);
  }
  std::
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ::clear((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
           *)0x18d6b2);
  return;
}

Assistant:

void STLDeleteElementsAndClear(Container* c) {
  for (typename Container::iterator iter = c->begin();
       iter != c->end(); ++iter) {
    if (*iter != NULL) {
      delete *iter;
    }
  }
  c->clear();
}